

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindAllExtensionNumbers
          (DescriptorPoolDatabase *this,StringViewArg extendee_type,
          vector<int,_std::allocator<int>_> *output)

{
  pointer ppFVar1;
  Descriptor *extendee;
  pointer ppFVar2;
  string_view name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  int local_4c;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_48;
  
  name._M_str = (extendee_type->_M_dataplus)._M_p;
  name._M_len = extendee_type->_M_string_length;
  extendee = DescriptorPool::FindMessageTypeByName(this->pool_,name);
  if (extendee != (Descriptor *)0x0) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DescriptorPool::FindAllExtensions
              (this->pool_,extendee,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&local_48);
    ppFVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar2 = local_48._M_impl.super__Vector_impl_data._M_start; ppFVar2 != ppFVar1;
        ppFVar2 = ppFVar2 + 1) {
      local_4c = (*ppFVar2)->number_;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_4c);
    }
    std::
    _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~_Vector_base(&local_48);
  }
  return extendee != (Descriptor *)0x0;
}

Assistant:

bool DescriptorPoolDatabase::FindAllExtensionNumbers(
    StringViewArg extendee_type, std::vector<int>* output) {
  const Descriptor* extendee = pool_.FindMessageTypeByName(extendee_type);
  if (extendee == nullptr) return false;

  std::vector<const FieldDescriptor*> extensions;
  pool_.FindAllExtensions(extendee, &extensions);

  for (const FieldDescriptor* extension : extensions) {
    output->push_back(extension->number());
  }

  return true;
}